

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.hpp
# Opt level: O0

bool __thiscall OpenMD::SelectionCompiler::unrecognizedExpressionToken(SelectionCompiler *this)

{
  bad_any_cast *anon_var_0;
  string tokenStr;
  any tmp;
  string *in_stack_ffffffffffffff18;
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  any *in_stack_ffffffffffffff28;
  string local_c0 [32];
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  string local_60 [32];
  string local_40 [32];
  undefined1 local_1;
  
  valuePeek((SelectionCompiler *)&stack0xffffffffffffffe0);
  std::__cxx11::string::string(local_40);
  std::any_cast<std::__cxx11::string>(in_stack_ffffffffffffff28);
  std::__cxx11::string::operator=(local_40,local_60);
  std::__cxx11::string::~string(local_60);
  std::operator+(in_stack_ffffffffffffff68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  local_1 = compileError((SelectionCompiler *)
                         CONCAT17(in_stack_ffffffffffffff27,
                                  CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)),
                         in_stack_ffffffffffffff18);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_40);
  std::any::~any((any *)0x3df26d);
  return (bool)(local_1 & 1);
}

Assistant:

bool unrecognizedExpressionToken() {
      std::any tmp = valuePeek();
      std::string tokenStr;

      try {
        tokenStr = std::any_cast<std::string>(tmp);
      } catch (const std::bad_any_cast&) {
        return compileError("any_cast error");
      }

      return compileError("unrecognized expression token:" + tokenStr);
    }